

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageBase.cpp
# Opt level: O1

void processLevel(string *s)

{
  size_type sVar1;
  pointer pcVar2;
  size_t __n;
  undefined1 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  _Alloc_hider __s2;
  int iVar5;
  level_enum lVar6;
  long lVar7;
  basic_string_view<char> *pbVar8;
  long *plVar9;
  mapped_type *pmVar10;
  size_type *psVar11;
  mapped_type mVar12;
  string *__range1;
  bool bVar13;
  size_type sVar14;
  pointer pbVar15;
  bool bVar16;
  string monitor_name;
  string level_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  monitors;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  sVar1 = s->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (s->_M_dataplus)._M_p;
    sVar14 = 0;
    do {
      iVar5 = tolower((int)pcVar2[sVar14]);
      pcVar2[sVar14] = (char)iVar5;
      sVar14 = sVar14 + 1;
    } while (sVar1 != sVar14);
  }
  lVar7 = std::__cxx11::string::find((char)s,0x3a);
  if (lVar7 == -1) {
    pbVar8 = std::
             __find_if<fmt::v10::basic_string_view<char>*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (spdlog::level::level_string_views,&PTR_typeinfo_001b6840,s);
    if (pbVar8 == (basic_string_view<char> *)&PTR_typeinfo_001b6840) {
      iVar5 = std::__cxx11::string::compare((char *)s);
      if (iVar5 == 0) {
        lVar6 = warn;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)s);
        lVar6 = (uint)(iVar5 != 0) * 2 + err;
      }
    }
    else {
      lVar6 = (level_enum)((ulong)(pbVar8 + -0x1b67d) >> 4);
    }
    if (lVar6 != off) {
      global_logging_level = lVar6;
      return;
    }
    std::operator+(&local_c8,"Invalid level name ",s);
    if ((spdlog::details::registry::instance()::s_instance == '\0') &&
       (iVar5 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance), iVar5 != 0)
       ) {
      spdlog::details::registry::registry
                ((registry *)spdlog::details::registry::instance()::s_instance);
      __cxa_atexit(spdlog::details::registry::~registry,
                   spdlog::details::registry::instance()::s_instance,&__dso_handle);
      __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
    }
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    spdlog::logger::log((logger *)spdlog::details::registry::instance()::s_instance._304_8_,0.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    invalid_level_option = true;
    return;
  }
  std::__cxx11::string::find((char)s,0x3a);
  std::__cxx11::string::substr((ulong)&local_c8,(ulong)s);
  std::__cxx11::string::substr((ulong)&local_a8,(ulong)s);
  prmon::get_all_registered_abi_cxx11_();
  __s2._M_p = local_c8._M_dataplus._M_p;
  if (local_60.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_60.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001766e3:
    std::operator+(&local_88,"Invalid monitor name ",&local_c8);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_88);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_e8.field_2._M_allocated_capacity = *psVar11;
      local_e8.field_2._8_4_ = (undefined4)plVar9[3];
      local_e8.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar11;
      local_e8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_e8._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((spdlog::details::registry::instance()::s_instance == '\0') &&
       (iVar5 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance), iVar5 != 0)
       ) {
      spdlog::details::registry::registry
                ((registry *)spdlog::details::registry::instance()::s_instance);
      __cxa_atexit(spdlog::details::registry::~registry,
                   spdlog::details::registry::instance()::s_instance,&__dso_handle);
      __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
    }
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log((logger *)spdlog::details::registry::instance()::s_instance._304_8_,0.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    pbVar4 = &local_88;
  }
  else {
    bVar13 = false;
    do {
      pbVar15 = local_60.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1;
      __n = (local_60.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
      if (__n == local_c8._M_string_length) {
        if (__n == 0) {
          bVar16 = true;
        }
        else {
          iVar5 = bcmp(((local_60.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,__s2._M_p,__n
                      );
          bVar16 = iVar5 == 0;
        }
      }
      else {
        bVar16 = false;
      }
      if (bVar16) {
        bVar13 = true;
        break;
      }
      local_60.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar15;
    } while (pbVar15 !=
             local_60.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (!bVar13) goto LAB_001766e3;
    pbVar8 = std::
             __find_if<fmt::v10::basic_string_view<char>*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (spdlog::level::level_string_views,&PTR_typeinfo_001b6840,&local_a8);
    if (pbVar8 == (basic_string_view<char> *)&PTR_typeinfo_001b6840) {
      iVar5 = std::__cxx11::string::compare((char *)&local_a8);
      if (iVar5 == 0) {
        mVar12 = warn;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_a8);
        mVar12 = (uint)(iVar5 != 0) * 2 + err;
      }
    }
    else {
      mVar12 = (mapped_type)((ulong)(pbVar8 + -0x1b67d) >> 4);
    }
    if (mVar12 != off) {
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
                ::operator[](&monitor_level_abi_cxx11_,&local_c8);
      *pmVar10 = mVar12;
      goto LAB_0017680c;
    }
    std::operator+(&local_e8,"Invalid level name ",&local_a8);
    if ((spdlog::details::registry::instance()::s_instance == '\0') &&
       (iVar5 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance), iVar5 != 0)
       ) {
      spdlog::details::registry::registry
                ((registry *)spdlog::details::registry::instance()::s_instance);
      __cxa_atexit(spdlog::details::registry::~registry,
                   spdlog::details::registry::instance()::s_instance,&__dso_handle);
      __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
    }
    local_88._M_dataplus._M_p = (pointer)0x0;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity = 0;
    spdlog::logger::log((logger *)spdlog::details::registry::instance()::s_instance._304_8_,0.0);
    pbVar4 = &local_e8;
  }
  puVar3 = (undefined1 *)(&(pbVar4->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3 != &pbVar4->field_2) {
    operator_delete(puVar3);
  }
  invalid_level_option = true;
LAB_0017680c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void processLevel(std::string s) {
  for (auto& ch : s) {
    ch = std::tolower(ch);
  }
  if (s.find(':') == std::string::npos) {
    // No ':' in option -> set global level
    spdlog::level::level_enum get_level_enum = spdlog::level::from_str(s);
    if (get_level_enum == 6) {
      // Invalid name
      spdlog::error("Invalid level name " + s);
      invalid_level_option = true;
    } else
      global_logging_level = get_level_enum;
  } else {
    size_t split_index = s.find(':');
    std::string monitor_name = s.substr(0, split_index);
    std::string level_name =
        s.substr(split_index + 1, s.size() - (split_index + 1));

    // Check validity of monitor name
    bool valid_monitor = false;
    auto monitors = prmon::get_all_registered();
    for (const auto& monitor : monitors) {
      if (monitor == monitor_name) {
        valid_monitor = true;
        break;
      }
    }
    if (!valid_monitor) {
      spdlog::error("Invalid monitor name " + monitor_name +
                    " for logging level");
      invalid_level_option = true;
      return;
    }
    // Check validity of level name
    spdlog::level::level_enum get_level_enum =
        spdlog::level::from_str(level_name);
    if (get_level_enum == 6) {
      // Invalid name
      spdlog::error("Invalid level name " + level_name);
      invalid_level_option = true;
      return;
    }

    monitor_level[monitor_name] = get_level_enum;
  }
}